

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  secp256k1_callback *in_RDX;
  uchar *in_RSI;
  secp256k1_scalar *in_RDI;
  int ret;
  secp256k1_scalar sec;
  int in_stack_00000024;
  secp256k1_scalar *in_stack_00000028;
  secp256k1_scalar *in_stack_00000030;
  uint in_stack_ffffffffffffffdc;
  uint local_4;
  
  if (in_RDI == (secp256k1_scalar *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/secp256k1.c"
            ,0x29b,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call(in_RDX,(char *)((ulong)in_stack_ffffffffffffffdc << 0x20));
    local_4 = 0;
  }
  else if (in_RDX == (secp256k1_callback *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,(char *)((ulong)in_stack_ffffffffffffffdc << 0x20));
    local_4 = 0;
  }
  else {
    uVar1 = secp256k1_scalar_set_b32_seckey
                      ((secp256k1_scalar *)in_RDX,
                       (uchar *)((ulong)in_stack_ffffffffffffffdc << 0x20));
    local_4 = secp256k1_ec_seckey_tweak_add_helper(in_RDI,in_RSI);
    local_4 = local_4 & uVar1;
    secp256k1_scalar_cmov(in_stack_00000030,in_stack_00000028,in_stack_00000024);
    secp256k1_scalar_get_b32
              ((uchar *)in_RDX,(secp256k1_scalar *)CONCAT44(in_stack_ffffffffffffffdc,local_4));
    secp256k1_scalar_clear((secp256k1_scalar *)0x1046f4);
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak32);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}